

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
         *this)

{
  double *pdVar1;
  float fVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar4;
  ShaderExecutor *pSVar5;
  Variable<tcu::Vector<float,_2>_> *pVVar6;
  pointer pcVar7;
  Variable<float> *pVVar8;
  double dVar9;
  pointer pVVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined8 uVar15;
  IVal *pIVar16;
  IVal *x;
  undefined8 *puVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  size_t sVar19;
  long lVar20;
  IVal IVar21;
  FloatFormat *pFVar22;
  undefined1 auVar23 [8];
  long lVar24;
  long lVar25;
  TestStatus *pTVar26;
  double dVar27;
  IVal in1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  IVal in0;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_> outputs;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffaa8;
  undefined1 local_550 [8];
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  undefined1 local_530 [8];
  undefined8 local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_520;
  _Rb_tree_node_base *local_510;
  double local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  string local_4f8;
  size_t local_4d8;
  ulong local_4d0;
  FloatFormat *local_4c8;
  long local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b8;
  double dStack_4b0;
  _Base_ptr p_Stack_4a8;
  TestStatus *local_4a0;
  undefined1 local_498 [8];
  double dStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_488;
  double local_478;
  double dStack_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2e8;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_> local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8 [2];
  ios_base local_138 [264];
  
  this_00 = this->m_samplings;
  pFVar22 = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar19 = (this->m_caseCtx).numRandoms;
  local_4a0 = __return_storage_ptr__;
  iVar13 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4c8 = pFVar22;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar22,(FloatFormat *)(ulong)PVar3,(Precision)sVar19,(ulong)(iVar13 + 0xdeadbeef),
             in_stack_fffffffffffffaa8);
  pVVar10 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar19 = (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>::Outputs(&local_2b8,sVar19)
  ;
  local_318.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2b8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_280 = local_2b8.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_498 = (undefined1  [8])local_500;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81((ostringstream *)&dStack_490,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_528 = (double)((ulong)local_528._4_4_ << 0x20);
  aStack_520._M_allocated_capacity = 0;
  local_508 = 0.0;
  pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  aStack_520._8_8_ = (_Rb_tree_node_base *)&local_528;
  local_510 = (_Rb_tree_node_base *)&local_528;
  local_4d8 = sVar19;
  (*pSVar4->_vptr_Statement[4])(pSVar4,local_530);
  if ((_Rb_tree_node_base *)aStack_520._8_8_ != (_Rb_tree_node_base *)&local_528) {
    uVar15 = aStack_520._8_8_;
    do {
      (**(code **)(**(long **)(uVar15 + 0x20) + 0x30))(*(long **)(uVar15 + 0x20),local_1a8);
      uVar15 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar15);
    } while ((_Rb_tree_node_base *)uVar15 != (_Rb_tree_node_base *)&local_528);
  }
  pFVar22 = local_4c8;
  sVar19 = local_4d8;
  if (local_508 != 0.0) {
    local_498 = (undefined1  [8])local_500;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_490,(char *)CONCAT44(local_550._4_4_,local_550._0_4_),local_548);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_550._4_4_,local_550._0_4_) != &local_540) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_550._4_4_,local_550._0_4_),
                      local_540._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_530);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar5 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5,sVar19 & 0xffffffff,&local_218,&local_288,0);
  local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffffffffff00);
  dStack_490 = INFINITY;
  aStack_488._M_allocated_capacity = 0xfff0000000000000;
  aStack_488._8_8_ = aStack_488._8_8_ & 0xffffffffffffff00;
  local_478 = INFINITY;
  dStack_470 = -INFINITY;
  local_530 = (undefined1  [8])((ulong)local_530 & 0xffffffffffffff00);
  local_528 = INFINITY;
  aStack_520._M_allocated_capacity = 0xfff0000000000000;
  local_1a8[0].m_data[0]._0_8_ = local_1a8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
  local_1a8[0].m_data[0].m_lo = INFINITY;
  local_1a8[0].m_data[0].m_hi = -INFINITY;
  local_1a8[0].m_data[1]._0_8_ = local_1a8[0].m_data[1]._0_8_ & 0xffffffffffffff00;
  local_1a8[0].m_data[1].m_lo = INFINITY;
  local_1a8[0].m_data[1].m_hi = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2e8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_498);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_550);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2e8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4b8);
  Environment::bind<float>
            ((Environment *)&local_2e8,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_530);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_2e8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             local_1a8);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar10) {
LAB_00887256:
    local_498 = (undefined1  [8])local_500;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"All ",4);
    pTVar26 = local_4a0;
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar26->m_code = QP_TEST_RESULT_PASS;
    (pTVar26->m_description)._M_dataplus._M_p = (pointer)&(pTVar26->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar26->m_description,local_498,
               (char *)((long)local_498 + (long)dStack_490));
    uVar15 = aStack_488._M_allocated_capacity;
    auVar23 = local_498;
    if (local_498 == (undefined1  [8])&aStack_488) goto LAB_0088743b;
  }
  else {
    lVar20 = sVar19 + (sVar19 == 0);
    lVar24 = 0;
    lVar25 = 0;
    local_4d0 = 0;
    do {
      local_4b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((ulong)local_4b8 & 0xffffffffffffff00);
      dStack_4b0 = INFINITY;
      p_Stack_4a8 = (_Base_ptr)0xfff0000000000000;
      local_1a8[0].m_data[0]._0_8_ = local_1a8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
      local_1a8[0].m_data[0].m_lo = INFINITY;
      local_1a8[0].m_data[0].m_hi = -INFINITY;
      local_1a8[0].m_data[1]._0_8_ = local_1a8[0].m_data[1]._0_8_ & 0xffffffffffffff00;
      local_1a8[0].m_data[1].m_lo = INFINITY;
      local_1a8[0].m_data[1].m_hi = -INFINITY;
      local_550._0_4_ =
           *(float *)((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar25);
      local_550._4_4_ =
           *(float *)((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar25 + 4);
      local_4c0 = lVar20;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_530,pFVar22,(Vector<float,_2> *)local_550);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_498,pFVar22,(IVal *)local_530);
      pIVar16 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar16->m_data[1].m_lo = local_478;
      pIVar16->m_data[1].m_hi = dStack_470;
      pIVar16->m_data[0].m_hi = (double)aStack_488._M_allocated_capacity;
      *(undefined8 *)(pIVar16->m_data + 1) = aStack_488._8_8_;
      pIVar16->m_data[0].m_hasNaN = local_498;
      pIVar16->m_data[0].m_lo = dStack_490;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2e8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_478 = pFVar22->m_maxValue;
      local_498 = *(undefined1 (*) [8])pFVar22;
      dStack_490 = *(double *)&pFVar22->m_fractionBits;
      aStack_488._M_allocated_capacity = *(undefined8 *)&pFVar22->m_hasInf;
      aStack_488._8_8_ = *(undefined8 *)&pFVar22->m_exactPrecision;
      dStack_470 = (double)CONCAT44(dStack_470._4_4_,(this->m_caseCtx).precision);
      local_460 = 0;
      pSVar4 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_468 = &local_2e8;
      (*pSVar4->_vptr_Statement[3])(pSVar4,(IVal *)local_498);
      pIVar16 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_2e8,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar16);
      local_1a8[0].m_data[1].m_lo = local_478;
      local_1a8[0].m_data[1].m_hi = dStack_470;
      local_1a8[0].m_data[0].m_hi = (double)aStack_488._M_allocated_capacity;
      local_1a8[0].m_data[1]._0_8_ = aStack_488._8_8_;
      local_1a8[0].m_data[0]._0_8_ = local_498;
      local_1a8[0].m_data[0].m_lo = dStack_490;
      bVar11 = contains<tcu::Vector<float,2>>
                         (local_1a8,
                          (Vector<float,_2> *)
                          ((long)(local_2b8.out1.
                                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar25));
      local_498 = (undefined1  [8])&aStack_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(&local_1f8,bVar11,(string *)local_498);
      if (local_498 != (undefined1  [8])&aStack_488) {
        operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
      }
      x = Environment::lookup<float>
                    ((Environment *)&local_2e8,
                     (this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_498,&local_318,x);
      p_Stack_4a8 = (_Base_ptr)aStack_488._M_allocated_capacity;
      local_4b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498;
      paVar18 = local_4b8;
      dStack_4b0 = dStack_490;
      fVar2 = *(float *)((long)local_2b8.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar24);
      dVar27 = (double)fVar2;
      dVar9 = dVar27;
      if (NAN(fVar2)) {
        dVar9 = INFINITY;
        dVar27 = -INFINITY;
      }
      IVar21 = (IVal)(dVar27 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar9);
      if ((NAN(fVar2)) &&
         (dVar27 <= (double)aStack_488._M_allocated_capacity && dStack_490 <= dVar9)) {
        local_4b8._0_1_ = local_498[0];
        IVar21 = local_4b8._0_1_;
      }
      local_498 = (undefined1  [8])&aStack_488;
      local_4b8 = paVar18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(&local_1f8,(bool)((byte)IVar21 & 1),(string *)local_498);
      if (local_498 != (undefined1  [8])&aStack_488) {
        operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
      }
      pFVar22 = local_4c8;
      if ((!bVar11 || !bVar12) &&
         (uVar14 = (int)local_4d0 + 1, local_4d0 = (ulong)uVar14, (int)uVar14 < 0x65)) {
        local_498 = (undefined1  [8])local_500;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
        pVVar6 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr
        ;
        paVar18 = &aStack_520;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_530 = (undefined1  [8])paVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)local_530,(long)local_528);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_550,(shaderexecutor *)&local_318,
                   (FloatFormat *)
                   ((long)(local_278.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar25),
                   (Vector<float,_2> *)&paVar18->_M_allocated_capacity);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)CONCAT44(local_550._4_4_,local_550._0_4_),
                   local_548);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_550._4_4_,local_550._0_4_) != &local_540) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_550._4_4_,local_550._0_4_),
                          local_540._M_allocated_capacity + 1);
        }
        if (local_530 != (undefined1  [8])&aStack_520) {
          operator_delete((void *)local_530,(ulong)(aStack_520._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
        pVVar8 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        local_530 = (undefined1  [8])&aStack_520;
        pcVar7 = (pVVar8->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar7,pcVar7 + (pVVar8->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)local_530,(long)local_528);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
        valueToString<float>
                  ((string *)local_550,&local_318,
                   (float *)((long)local_2b8.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar24));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)CONCAT44(local_550._4_4_,local_550._0_4_),
                   local_548);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,"\tExpected range: ",0x11);
        intervalToString<float>(&local_4f8,&local_318,(IVal *)&local_4b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_550._4_4_,local_550._0_4_) != &local_540) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_550._4_4_,local_550._0_4_),
                          local_540._M_allocated_capacity + 1);
        }
        if (local_530 != (undefined1  [8])&aStack_520) {
          operator_delete((void *)local_530,(ulong)(aStack_520._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\t",1);
        pVVar6 = (this->m_variables).out1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr
        ;
        paVar18 = &aStack_520;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_530 = (undefined1  [8])paVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)local_530,(long)local_528);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_550,(shaderexecutor *)&local_318,
                   (FloatFormat *)
                   ((long)(local_2b8.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar25),
                   (Vector<float,_2> *)&paVar18->_M_allocated_capacity);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,(char *)CONCAT44(local_550._4_4_,local_550._0_4_),
                   local_548);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_4f8,(shaderexecutor *)&local_318,(FloatFormat *)local_1a8,(IVal *)paVar18)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_490,local_4f8._M_dataplus._M_p,local_4f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_550._4_4_,local_550._0_4_) != &local_540) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_550._4_4_,local_550._0_4_),
                          local_540._M_allocated_capacity + 1);
        }
        if (local_530 != (undefined1  [8])&aStack_520) {
          operator_delete((void *)local_530,(ulong)(aStack_520._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
        std::ios_base::~ios_base(local_420);
      }
      lVar25 = lVar25 + 8;
      lVar24 = lVar24 + 4;
      lVar20 = local_4c0 + -1;
    } while (lVar20 != 0);
    iVar13 = (int)local_4d0;
    if (iVar13 < 0x65) {
      if (iVar13 == 0) goto LAB_00887256;
    }
    else {
      local_498 = (undefined1  [8])local_500;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_490,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
      std::ios_base::~ios_base(local_420);
    }
    local_498 = (undefined1  [8])local_500;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_490);
    std::ostream::operator<<((ostringstream *)&dStack_490,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_490," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_490);
    std::ios_base::~ios_base(local_420);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,iVar13);
    pTVar26 = local_4a0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    local_498 = (undefined1  [8])&aStack_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    uVar15 = (_Base_ptr)0xf;
    if (local_530 != (undefined1  [8])&aStack_520) {
      uVar15 = aStack_520._M_allocated_capacity;
    }
    if ((ulong)uVar15 < (_Base_ptr)((long)dStack_490 + (long)local_528)) {
      uVar15 = (_Base_ptr)0xf;
      if (local_498 != (undefined1  [8])&aStack_488) {
        uVar15 = aStack_488._M_allocated_capacity;
      }
      if ((ulong)uVar15 < (_Base_ptr)((long)dStack_490 + (long)local_528)) goto LAB_00887247;
      puVar17 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_498,0,(char *)0x0,(ulong)local_530);
    }
    else {
LAB_00887247:
      puVar17 = (undefined8 *)std::__cxx11::string::_M_append(local_530,(ulong)local_498);
    }
    local_1a8[0].m_data[0]._0_8_ = &local_1a8[0].m_data[0].m_hi;
    pdVar1 = (double *)(puVar17 + 2);
    if ((double *)*puVar17 == pdVar1) {
      local_1a8[0].m_data[0].m_hi = *pdVar1;
      local_1a8[0].m_data[1]._0_8_ = puVar17[3];
    }
    else {
      local_1a8[0].m_data[0].m_hi = *pdVar1;
      local_1a8[0].m_data[0]._0_8_ = (double *)*puVar17;
    }
    local_1a8[0].m_data[0].m_lo = (double)puVar17[1];
    *puVar17 = pdVar1;
    puVar17[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar26->m_code = QP_TEST_RESULT_FAIL;
    (pTVar26->m_description)._M_dataplus._M_p = (pointer)&(pTVar26->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar26->m_description,local_1a8[0].m_data[0]._0_8_,
               (undefined1 *)(local_1a8[0].m_data[0]._0_8_ + (long)local_1a8[0].m_data[0].m_lo));
    if ((double *)local_1a8[0].m_data[0]._0_8_ != &local_1a8[0].m_data[0].m_hi) {
      operator_delete((void *)local_1a8[0].m_data[0]._0_8_,
                      (ulong)((long)(_Rb_tree_color *)local_1a8[0].m_data[0].m_hi + 1));
    }
    if (local_498 != (undefined1  [8])&aStack_488) {
      operator_delete((void *)local_498,(ulong)(aStack_488._M_allocated_capacity + 1));
    }
    uVar15 = aStack_520._M_allocated_capacity;
    auVar23 = local_530;
    if (local_530 == (undefined1  [8])&aStack_520) goto LAB_0088743b;
  }
  operator_delete((void *)auVar23,(ulong)((long)&((_Base_ptr)uVar15)->_M_color + 1));
LAB_0088743b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2e8);
  if (local_2b8.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar26;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}